

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O3

aiNode * __thiscall
Assimp::ColladaLoader::BuildHierarchy(ColladaLoader *this,ColladaParser *pParser,Node *pNode)

{
  pointer ppNVar1;
  aiNode *this_00;
  aiNode **ppaVar2;
  aiNode *paVar3;
  pointer ppNVar4;
  uint uVar5;
  pointer ppNVar6;
  ulong uVar7;
  undefined1 auVar8 [8];
  vector<const_Assimp::Collada::Node_*,_std::allocator<const_Assimp::Collada::Node_*>_> instances;
  undefined1 local_78 [8];
  pointer ppNStack_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68 [3];
  
  this_00 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(this_00);
  FindNameForNode_abi_cxx11_((string *)local_78,this,pNode);
  ppNVar4 = ppNStack_70;
  auVar8 = local_78;
  if (ppNStack_70 < (pointer)0x400) {
    (this_00->mName).length = (ai_uint32)ppNStack_70;
    memcpy((this_00->mName).data,(void *)local_78,(size_t)ppNStack_70);
    (this_00->mName).data[(long)ppNVar4] = '\0';
  }
  if (auVar8 != (undefined1  [8])local_68) {
    operator_delete((void *)auVar8,local_68[0]._M_allocated_capacity + 1);
  }
  ColladaParser::CalculateResultTransform((aiMatrix4x4 *)local_78,pParser,&pNode->mTransforms);
  (this_00->mTransformation).d1 = (float)local_68[2]._0_4_;
  (this_00->mTransformation).d2 = (float)local_68[2]._4_4_;
  (this_00->mTransformation).d3 = (float)local_68[2]._8_4_;
  (this_00->mTransformation).d4 = (float)local_68[2]._12_4_;
  (this_00->mTransformation).c1 = (float)local_68[1]._0_4_;
  (this_00->mTransformation).c2 = (float)local_68[1]._4_4_;
  (this_00->mTransformation).c3 = (float)local_68[1]._8_4_;
  (this_00->mTransformation).c4 = (float)local_68[1]._12_4_;
  (this_00->mTransformation).b1 = (float)local_68[0]._0_4_;
  (this_00->mTransformation).b2 = (float)local_68[0]._4_4_;
  (this_00->mTransformation).b3 = (float)local_68[0]._8_4_;
  (this_00->mTransformation).b4 = (float)local_68[0]._12_4_;
  (this_00->mTransformation).a1 = (float)local_78._0_4_;
  (this_00->mTransformation).a2 = (float)local_78._4_4_;
  *(pointer *)&(this_00->mTransformation).a3 = ppNStack_70;
  local_78 = (undefined1  [8])0x0;
  ppNStack_70 = (pointer)0x0;
  local_68[0]._M_allocated_capacity = 0;
  ResolveNodeInstances
            (this,pParser,pNode,
             (vector<const_Assimp::Collada::Node_*,_std::allocator<const_Assimp::Collada::Node_*>_>
              *)local_78);
  ppNVar4 = ppNStack_70;
  auVar8 = local_78;
  ppNVar6 = (pNode->mChildren).
            super__Vector_base<Assimp::Collada::Node_*,_std::allocator<Assimp::Collada::Node_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppNVar1 = (pNode->mChildren).
            super__Vector_base<Assimp::Collada::Node_*,_std::allocator<Assimp::Collada::Node_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  uVar5 = (int)((long)ppNStack_70 - (long)local_78 >> 3) + (int)((long)ppNVar1 - (long)ppNVar6 >> 3)
  ;
  this_00->mNumChildren = uVar5;
  ppaVar2 = (aiNode **)operator_new__((ulong)uVar5 << 3);
  this_00->mChildren = ppaVar2;
  if (ppNVar1 != ppNVar6) {
    uVar7 = 0;
    do {
      paVar3 = BuildHierarchy(this,pParser,ppNVar6[uVar7]);
      this_00->mChildren[uVar7] = paVar3;
      this_00->mChildren[uVar7]->mParent = this_00;
      uVar7 = uVar7 + 1;
      ppNVar6 = (pNode->mChildren).
                super__Vector_base<Assimp::Collada::Node_*,_std::allocator<Assimp::Collada::Node_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppNVar4 = ppNStack_70;
      auVar8 = local_78;
    } while (uVar7 < (ulong)((long)(pNode->mChildren).
                                   super__Vector_base<Assimp::Collada::Node_*,_std::allocator<Assimp::Collada::Node_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppNVar6 >> 3))
    ;
  }
  if ((undefined1  [8])ppNVar4 != auVar8) {
    uVar7 = 0;
    do {
      paVar3 = BuildHierarchy(this,pParser,*(pointer)((long)auVar8 + uVar7 * 8));
      *(aiNode **)
       ((long)this_00->mChildren +
       (long)(pNode->mChildren).
             super__Vector_base<Assimp::Collada::Node_*,_std::allocator<Assimp::Collada::Node_*>_>.
             _M_impl.super__Vector_impl_data._M_finish +
       (uVar7 * 8 -
       (long)(pNode->mChildren).
             super__Vector_base<Assimp::Collada::Node_*,_std::allocator<Assimp::Collada::Node_*>_>.
             _M_impl.super__Vector_impl_data._M_start)) = paVar3;
      *(aiNode **)
       (*(long *)((long)this_00->mChildren +
                 (long)(pNode->mChildren).
                       super__Vector_base<Assimp::Collada::Node_*,_std::allocator<Assimp::Collada::Node_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish +
                 (uVar7 * 8 -
                 (long)(pNode->mChildren).
                       super__Vector_base<Assimp::Collada::Node_*,_std::allocator<Assimp::Collada::Node_*>_>
                       ._M_impl.super__Vector_impl_data._M_start)) + 0x448) = this_00;
      uVar7 = uVar7 + 1;
      auVar8 = local_78;
    } while (uVar7 < (ulong)((long)ppNStack_70 - (long)local_78 >> 3));
  }
  BuildMeshesForNode(this,pParser,pNode,this_00);
  BuildCamerasForNode(this,pParser,pNode,this_00);
  BuildLightsForNode(this,pParser,pNode,this_00);
  if (local_78 != (undefined1  [8])0x0) {
    operator_delete((void *)local_78,local_68[0]._M_allocated_capacity - (long)local_78);
  }
  return this_00;
}

Assistant:

aiNode* ColladaLoader::BuildHierarchy(const ColladaParser& pParser, const Collada::Node* pNode) {
    // create a node for it
    aiNode* node = new aiNode();

    // find a name for the new node. It's more complicated than you might think
    node->mName.Set(FindNameForNode(pNode));

    // calculate the transformation matrix for it
    node->mTransformation = pParser.CalculateResultTransform(pNode->mTransforms);

    // now resolve node instances
    std::vector<const Collada::Node*> instances;
    ResolveNodeInstances(pParser, pNode, instances);

    // add children. first the *real* ones
    node->mNumChildren = static_cast<unsigned int>(pNode->mChildren.size() + instances.size());
    node->mChildren = new aiNode*[node->mNumChildren];

    for (size_t a = 0; a < pNode->mChildren.size(); ++a) {
        node->mChildren[a] = BuildHierarchy(pParser, pNode->mChildren[a]);
        node->mChildren[a]->mParent = node;
    }

    // ... and finally the resolved node instances
    for (size_t a = 0; a < instances.size(); ++a) {
        node->mChildren[pNode->mChildren.size() + a] = BuildHierarchy(pParser, instances[a]);
        node->mChildren[pNode->mChildren.size() + a]->mParent = node;
    }

    // construct meshes
    BuildMeshesForNode(pParser, pNode, node);

    // construct cameras
    BuildCamerasForNode(pParser, pNode, node);

    // construct lights
    BuildLightsForNode(pParser, pNode, node);

    return node;
}